

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_7_channels_with_3_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  long lVar29;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  do {
    lVar29 = (long)horizontal_contributors->n0;
    fVar5 = *horizontal_coefficients;
    fVar6 = horizontal_coefficients[1];
    fVar7 = horizontal_coefficients[2];
    pfVar2 = decode_buffer + lVar29 * 7;
    fVar8 = *pfVar2;
    fVar9 = pfVar2[1];
    fVar10 = pfVar2[2];
    fVar11 = pfVar2[3];
    pfVar2 = decode_buffer + lVar29 * 7 + 3;
    fVar12 = pfVar2[1];
    fVar13 = pfVar2[2];
    fVar14 = pfVar2[3];
    pfVar3 = decode_buffer + lVar29 * 7 + 7;
    fVar15 = *pfVar3;
    fVar16 = pfVar3[1];
    fVar17 = pfVar3[2];
    fVar18 = pfVar3[3];
    pfVar3 = decode_buffer + lVar29 * 7 + 10;
    fVar19 = pfVar3[1];
    fVar20 = pfVar3[2];
    fVar21 = pfVar3[3];
    pfVar4 = decode_buffer + lVar29 * 7 + 0xe;
    fVar22 = *pfVar4;
    fVar23 = pfVar4[1];
    fVar24 = pfVar4[2];
    fVar25 = pfVar4[3];
    pfVar4 = decode_buffer + lVar29 * 7 + 0x11;
    fVar26 = pfVar4[1];
    fVar27 = pfVar4[2];
    fVar28 = pfVar4[3];
    output_buffer[3] = *pfVar4 * fVar7 + fVar6 * *pfVar3 + *pfVar2 * fVar5;
    output_buffer[4] = fVar26 * fVar7 + fVar6 * fVar19 + fVar12 * fVar5;
    output_buffer[5] = fVar27 * fVar7 + fVar6 * fVar20 + fVar13 * fVar5;
    output_buffer[6] = fVar28 * fVar7 + fVar6 * fVar21 + fVar14 * fVar5;
    *output_buffer = fVar22 * fVar7 + fVar15 * fVar6 + fVar8 * fVar5;
    output_buffer[1] = fVar23 * fVar7 + fVar16 * fVar6 + fVar9 * fVar5;
    output_buffer[2] = fVar24 * fVar7 + fVar17 * fVar6 + fVar10 * fVar5;
    output_buffer[3] = fVar25 * fVar7 + fVar18 * fVar6 + fVar11 * fVar5;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_3_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__3_coeff_only();
    stbir__store_output_tiny();
  } while ( output < output_end );
}